

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O2

bool cmInstallCommandArguments::CheckPermissions(string *onePermission,string *permissions)

{
  char *__rhs;
  bool bVar1;
  char **valid;
  char **ppcVar2;
  
  ppcVar2 = PermissionsTable;
  do {
    __rhs = *ppcVar2;
    if (__rhs == (char *)0x0) goto LAB_003818dd;
    bVar1 = std::operator==(onePermission,__rhs);
    ppcVar2 = ppcVar2 + 1;
  } while (!bVar1);
  std::__cxx11::string::append((char *)permissions);
  std::__cxx11::string::append((string *)permissions);
LAB_003818dd:
  return __rhs != (char *)0x0;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions(
  const std::string& onePermission, std::string& permissions)
{
  // Check the permission against the table.
  for (const char** valid = cmInstallCommandArguments::PermissionsTable;
       *valid; ++valid) {
    if (onePermission == *valid) {
      // This is a valid permission.
      permissions += " ";
      permissions += onePermission;
      return true;
    }
  }
  // This is not a valid permission.
  return false;
}